

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O0

void ReadUserInfo(FSerializer *arc,userinfo_t *info,FString *skin)

{
  bool bVar1;
  int iVar2;
  FName local_4c;
  UCVarValue local_48;
  char *str;
  char *key;
  UCVarValue val;
  FBaseCVar **cvar;
  FString *pFStack_20;
  FName name;
  FString *skin_local;
  userinfo_t *info_local;
  FSerializer *arc_local;
  
  pFStack_20 = skin;
  FName::FName((FName *)((long)&cvar + 4));
  userinfo_t::Reset(info);
  FString::operator=(pFStack_20,(char *)0x0);
  bVar1 = FSerializer::BeginObject(arc,"userinfo");
  if (bVar1) {
    while (str = FSerializer::GetKey(arc), str != (char *)0x0) {
      FSerializer::StringPtr(arc,(char *)0x0,&local_48.String);
      FName::operator=((FName *)((long)&cvar + 4),str);
      FName::FName(&local_4c,(FName *)((long)&cvar + 4));
      val.String = (char *)TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                           ::CheckKey(&info->
                                       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                                      ,&local_4c);
      if (((FBaseCVar **)val.String != (FBaseCVar **)0x0) &&
         (*(FBaseCVar **)val.String != (FBaseCVar *)0x0)) {
        iVar2 = FName::operator_cast_to_int((FName *)((long)&cvar + 4));
        if (iVar2 == 0x203) {
          iVar2 = atoi(local_48.String);
          userinfo_t::TeamChanged(info,iVar2);
        }
        else if (iVar2 == 0x208) {
          FString::operator=(pFStack_20,local_48.String);
        }
        else if (iVar2 == 0x23c) {
          userinfo_t::PlayerClassChanged(info,local_48.String);
        }
        else {
          key = local_48.String;
          FBaseCVar::SetGenericRep(*(FBaseCVar **)val.String,local_48,CVAR_String);
        }
      }
    }
    FSerializer::EndObject(arc);
  }
  return;
}

Assistant:

void ReadUserInfo(FSerializer &arc, userinfo_t &info, FString &skin)
{
	FName name;
	FBaseCVar **cvar;
	UCVarValue val;
	const char *key;
	const char *str;

	info.Reset();
	skin = NULL;
	if (arc.BeginObject("userinfo"))
	{
		while ((key = arc.GetKey()))
		{
			arc.StringPtr(nullptr, str);
			name = key;
			cvar = info.CheckKey(name);
			if (cvar != NULL && *cvar != NULL)
			{
				switch (name)
				{
				case NAME_Team:			info.TeamChanged(atoi(str)); break;
				case NAME_Skin:			skin = str; break;	// Caller must call SkinChanged() once current calss is known
				case NAME_PlayerClass:	info.PlayerClassChanged(str); break;
				default:
					val.String = str;
					(*cvar)->SetGenericRep(val, CVAR_String);
					break;
				}
			}
		}
		arc.EndObject();
	}
}